

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

Offset<const_flatbuffers::Table_*>
flatbuffers::CopyTable
          (FlatBufferBuilder *fbb,Schema *schema,Object *objectdef,Table *table,
          bool use_string_pooling)

{
  uint8_t **ppuVar1;
  FlatBufferBuilder *this;
  bool bVar2;
  bool bVar3;
  uint16_t uVar4;
  BaseType BVar5;
  Offset<flatbuffers::String> OVar6;
  Offset<const_flatbuffers::Table_*> OVar7;
  int32_t iVar8;
  int32_t iVar9;
  uoffset_t uVar10;
  Type *pTVar11;
  String *pSVar12;
  Object *objectdef_00;
  Table *pTVar13;
  Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *this_00;
  return_type pSVar14;
  return_type table_00;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *pVVar15;
  char *pcVar16;
  return_type pOVar17;
  int __c;
  int __c_00;
  int __c_01;
  uoffset_t i;
  size_t elemsize;
  ulong uVar18;
  const_iterator it;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar19;
  Table *__s;
  undefined7 in_register_00000081;
  uoffset_t i_1;
  size_t alignment;
  uint8_t *offset_location;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar20;
  long lVar21;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *this_01;
  uoffset_t offset;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsets;
  vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
  elements;
  value_type_conflict4 local_9c;
  FlatBufferBuilder *local_98;
  allocator_type local_8d;
  uoffset_t local_8c;
  Table *local_88;
  Schema *local_80;
  Object *local_78;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *local_70;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *local_50;
  _Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
  local_48;
  
  local_8c = (uoffset_t)CONCAT71(in_register_00000081,use_string_pooling);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = fbb;
  local_80 = schema;
  local_78 = objectdef;
  local_50 = reflection::Object::fields(objectdef);
  pVVar20 = local_50 + 4;
  local_88 = table;
  local_70 = pVVar20;
  for (; pVVar19 = local_50, pVVar20 != local_70 + (uint)(*(int *)local_50 << 2);
      pVVar20 = pVVar20 + 4) {
    pVVar19 = pVVar20 + *(uint *)pVVar20;
    uVar4 = reflection::Field::offset((Field *)pVVar19);
    if ((uVar4 < *(ushort *)(local_88 + -(long)*(int *)local_88)) &&
       (*(short *)(local_88 + ((ulong)uVar4 - (long)*(int *)local_88)) != 0)) {
      local_9c = 0;
      __s = local_88;
      pTVar11 = reflection::Field::type((Field *)pVVar19);
      BVar5 = reflection::Type::base_type(pTVar11);
      pTVar13 = local_88;
      bVar3 = (bool)(char)local_8c;
      switch(BVar5) {
      case String:
        if ((bool)(char)local_8c == false) {
          pSVar12 = GetFieldS(local_88,(Field *)pVVar19);
          local_9c = (value_type_conflict4)
                     FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                               (local_98,pSVar12);
        }
        else {
          pSVar12 = GetFieldS(local_88,(Field *)pVVar19);
          local_9c = (value_type_conflict4)
                     FlatBufferBuilderImpl<false>::CreateSharedString(local_98,pSVar12);
        }
        break;
      case Vector:
        uVar4 = reflection::Field::offset((Field *)pVVar19);
        pcVar16 = (char *)(ulong)uVar4;
        this_00 = Table::
                  GetPointer<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::Table>,unsigned_int>const*,unsigned_int>
                            (local_88,uVar4);
        pTVar11 = reflection::Field::type((Field *)pVVar19);
        BVar5 = reflection::Type::element(pTVar11);
        if (BVar5 == String) {
          std::
          vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
          ::vector((vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                    *)&local_48,(ulong)*(uint *)this_00,&local_8d);
          for (uVar18 = 0; uVar18 < *(uint *)this_00; uVar18 = uVar18 + 1) {
            if ((char)local_8c == '\0') {
              pSVar14 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get
                                  ((Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *
                                   )this_00,(uint)uVar18);
              OVar6 = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                                (local_98,pSVar14);
            }
            else {
              pSVar14 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get
                                  ((Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *
                                   )this_00,(uint)uVar18);
              OVar6 = FlatBufferBuilderImpl<false>::CreateSharedString(local_98,pSVar14);
            }
            local_48._M_impl.super__Vector_impl_data._M_start[uVar18].o = OVar6.o;
          }
          local_9c = (value_type_conflict4)
                     FlatBufferBuilderImpl<false>::
                     CreateVector<flatbuffers::Offset<flatbuffers::String_const*>,std::allocator<flatbuffers::Offset<flatbuffers::String_const*>>>
                               (local_98,(vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                          *)&local_48);
          std::
          _Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
          ::~_Vector_base(&local_48);
        }
        else {
          if (BVar5 == Obj) {
            pVVar15 = reflection::Schema::objects(local_80);
            pTVar11 = reflection::Field::type((Field *)pVVar19);
            pcVar16 = reflection::Type::index(pTVar11,pcVar16,__c_00);
            pOVar17 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                                (pVVar15,(uint)pcVar16);
            bVar2 = reflection::Object::is_struct(pOVar17);
            alignment = GetTypeSize(reflection::BaseType)::sizes._120_8_;
            if (!bVar2) {
              std::
              vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
              ::vector((vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
                        *)&local_48,(ulong)*(uint *)this_00,(allocator_type *)&local_8d);
              for (uVar18 = 0; uVar18 < *(uint *)this_00; uVar18 = uVar18 + 1) {
                table_00 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::Get
                                     (this_00,(uint)uVar18);
                OVar7 = CopyTable(local_98,local_80,pOVar17,table_00,bVar3);
                local_48._M_impl.super__Vector_impl_data._M_start[uVar18].o = OVar7.o;
              }
              local_9c = (value_type_conflict4)
                         FlatBufferBuilderImpl<false>::
                         CreateVector<flatbuffers::Offset<flatbuffers::Table_const*>,std::allocator<flatbuffers::Offset<flatbuffers::Table_const*>>>
                                   (local_98,(vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
                                              *)&local_48);
              std::
              _Vector_base<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
              ::~_Vector_base((_Vector_base<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
                               *)&local_48);
              break;
            }
            bVar3 = reflection::Object::is_struct(pOVar17);
            elemsize = alignment;
            if (bVar3) {
              iVar8 = reflection::Object::bytesize(pOVar17);
              elemsize = (long)iVar8;
            }
          }
          else {
            elemsize = *(size_t *)(GetTypeSize(reflection::BaseType)::sizes + (ulong)BVar5 * 8);
            alignment = elemsize;
          }
          this = local_98;
          FlatBufferBuilderImpl<false>::StartVector<flatbuffers::Offset,unsigned_int>
                    (local_98,(ulong)*(uint *)this_00,elemsize,alignment);
          vector_downward<unsigned_int>::push
                    (&this->buf_,(uint8_t *)(this_00 + 4),elemsize * *(uint *)this_00);
          local_9c = FlatBufferBuilderImpl<false>::EndVector<unsigned_int,unsigned_int>
                               (this,(ulong)*(uint *)this_00);
        }
        break;
      case Obj:
        pVVar15 = reflection::Schema::objects(local_80);
        pTVar11 = reflection::Field::type((Field *)pVVar19);
        pcVar16 = reflection::Type::index(pTVar11,(char *)__s,__c);
        pOVar17 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                            (pVVar15,(uint)pcVar16);
        bVar2 = reflection::Object::is_struct(pOVar17);
        if (!bVar2) {
          pTVar13 = GetFieldT(local_88,(Field *)pVVar19);
          local_9c = (value_type_conflict4)CopyTable(local_98,local_80,pOVar17,pTVar13,bVar3);
        }
        break;
      case Union:
        objectdef_00 = GetUnionType(local_80,local_78,(Field *)pVVar19,local_88);
        pTVar13 = GetFieldT(pTVar13,(Field *)pVVar19);
        local_9c = (value_type_conflict4)CopyTable(local_98,local_80,objectdef_00,pTVar13,bVar3);
      }
      if (local_9c != 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,&local_9c);
      }
    }
  }
  bVar3 = reflection::Object::is_struct(local_78);
  if (bVar3) {
    iVar8 = reflection::Object::minalign(local_78);
    local_8c = FlatBufferBuilderImpl<false>::StartStruct(local_98,(long)iVar8);
  }
  else {
    local_8c = FlatBufferBuilderImpl<false>::StartTable(local_98);
  }
  lVar21 = 0;
  pVVar20 = local_70;
  do {
    if (pVVar20 == local_70 + (uint)(*(int *)pVVar19 << 2)) {
      if (lVar21 != (long)local_68._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_68._M_impl.super__Vector_impl_data._M_start >> 2) {
        __assert_fail("offset_idx == offsets.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/reflection.cpp"
                      ,0x2e6,
                      "Offset<const Table *> flatbuffers::CopyTable(FlatBufferBuilder &, const reflection::Schema &, const reflection::Object &, const Table &, bool)"
                     );
      }
      bVar3 = reflection::Object::is_struct(local_78);
      if (bVar3) {
        uVar10 = (local_98->buf_).size_;
        ppuVar1 = &(local_98->buf_).scratch_;
        *ppuVar1 = *ppuVar1 + (ulong)local_98->num_field_loc * -8;
        local_98->num_field_loc = 0;
        local_98->max_voffset_ = 0;
      }
      else {
        uVar10 = FlatBufferBuilderImpl<false>::EndTable(local_98,local_8c);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
      return (Offset<const_flatbuffers::Table_*>)uVar10;
    }
    this_01 = pVVar20 + *(uint *)pVVar20;
    uVar4 = reflection::Field::offset((Field *)this_01);
    if ((*(ushort *)(local_88 + -(long)*(int *)local_88) <= uVar4) ||
       (*(short *)(local_88 + ((ulong)uVar4 - (long)*(int *)local_88)) == 0)) goto LAB_0013bc17;
    pTVar13 = local_88;
    pTVar11 = reflection::Field::type((Field *)this_01);
    BVar5 = reflection::Type::base_type(pTVar11);
    if (BVar5 - String < 2) {
LAB_0013bbf6:
      uVar4 = reflection::Field::offset((Field *)this_01);
      FlatBufferBuilderImpl<false>::AddOffset<void>
                (local_98,uVar4,
                 (Offset<void>)local_68._M_impl.super__Vector_impl_data._M_start[lVar21]);
      lVar21 = lVar21 + 1;
    }
    else if (BVar5 == Obj) {
      pVVar15 = reflection::Schema::objects(local_80);
      pTVar11 = reflection::Field::type((Field *)this_01);
      pcVar16 = reflection::Type::index(pTVar11,(char *)pTVar13,__c_01);
      pOVar17 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                          (pVVar15,(uint)pcVar16);
      bVar3 = reflection::Object::is_struct(pOVar17);
      if (!bVar3) goto LAB_0013bbf6;
      iVar8 = reflection::Object::minalign(pOVar17);
      iVar9 = reflection::Object::bytesize(pOVar17);
      anon_unknown_94::CopyInline(local_98,(Field *)this_01,local_88,(long)iVar8,(long)iVar9);
    }
    else {
      if (BVar5 == Union) goto LAB_0013bbf6;
      anon_unknown_94::CopyInline
                (local_98,(Field *)this_01,local_88,
                 *(size_t *)(GetTypeSize(reflection::BaseType)::sizes + (ulong)BVar5 * 8),
                 *(size_t *)(GetTypeSize(reflection::BaseType)::sizes + (ulong)BVar5 * 8));
    }
LAB_0013bc17:
    pVVar20 = pVVar20 + 4;
  } while( true );
}

Assistant:

Offset<const Table *> CopyTable(FlatBufferBuilder &fbb,
                                const reflection::Schema &schema,
                                const reflection::Object &objectdef,
                                const Table &table, bool use_string_pooling) {
  // Before we can construct the table, we have to first generate any
  // subobjects, and collect their offsets.
  std::vector<uoffset_t> offsets;
  auto fielddefs = objectdef.fields();
  for (auto it = fielddefs->begin(); it != fielddefs->end(); ++it) {
    auto &fielddef = **it;
    // Skip if field is not present in the source.
    if (!table.CheckField(fielddef.offset())) continue;
    uoffset_t offset = 0;
    switch (fielddef.type()->base_type()) {
      case reflection::String: {
        offset = use_string_pooling
                     ? fbb.CreateSharedString(GetFieldS(table, fielddef)).o
                     : fbb.CreateString(GetFieldS(table, fielddef)).o;
        break;
      }
      case reflection::Obj: {
        auto &subobjectdef = *schema.objects()->Get(fielddef.type()->index());
        if (!subobjectdef.is_struct()) {
          offset = CopyTable(fbb, schema, subobjectdef,
                             *GetFieldT(table, fielddef), use_string_pooling)
                       .o;
        }
        break;
      }
      case reflection::Union: {
        auto &subobjectdef = GetUnionType(schema, objectdef, fielddef, table);
        offset = CopyTable(fbb, schema, subobjectdef,
                           *GetFieldT(table, fielddef), use_string_pooling)
                     .o;
        break;
      }
      case reflection::Vector: {
        auto vec =
            table.GetPointer<const Vector<Offset<Table>> *>(fielddef.offset());
        auto element_base_type = fielddef.type()->element();
        auto elemobjectdef =
            element_base_type == reflection::Obj
                ? schema.objects()->Get(fielddef.type()->index())
                : nullptr;
        switch (element_base_type) {
          case reflection::String: {
            std::vector<Offset<const String *>> elements(vec->size());
            auto vec_s = reinterpret_cast<const Vector<Offset<String>> *>(vec);
            for (uoffset_t i = 0; i < vec_s->size(); i++) {
              elements[i] = use_string_pooling
                                ? fbb.CreateSharedString(vec_s->Get(i)).o
                                : fbb.CreateString(vec_s->Get(i)).o;
            }
            offset = fbb.CreateVector(elements).o;
            break;
          }
          case reflection::Obj: {
            if (!elemobjectdef->is_struct()) {
              std::vector<Offset<const Table *>> elements(vec->size());
              for (uoffset_t i = 0; i < vec->size(); i++) {
                elements[i] = CopyTable(fbb, schema, *elemobjectdef,
                                        *vec->Get(i), use_string_pooling);
              }
              offset = fbb.CreateVector(elements).o;
              break;
            }
          }
            FLATBUFFERS_FALLTHROUGH();  // fall thru
          default: {                    // Scalars and structs.
            auto element_size = GetTypeSize(element_base_type);
            auto element_alignment = element_size;  // For primitive elements
            if (elemobjectdef && elemobjectdef->is_struct())
              element_size = elemobjectdef->bytesize();
            fbb.StartVector(vec->size(), element_size, element_alignment);
            fbb.PushBytes(vec->Data(), element_size * vec->size());
            offset = fbb.EndVector(vec->size());
            break;
          }
        }
        break;
      }
      default:  // Scalars.
        break;
    }
    if (offset) { offsets.push_back(offset); }
  }
  // Now we can build the actual table from either offsets or scalar data.
  auto start = objectdef.is_struct() ? fbb.StartStruct(objectdef.minalign())
                                     : fbb.StartTable();
  size_t offset_idx = 0;
  for (auto it = fielddefs->begin(); it != fielddefs->end(); ++it) {
    auto &fielddef = **it;
    if (!table.CheckField(fielddef.offset())) continue;
    auto base_type = fielddef.type()->base_type();
    switch (base_type) {
      case reflection::Obj: {
        auto &subobjectdef = *schema.objects()->Get(fielddef.type()->index());
        if (subobjectdef.is_struct()) {
          CopyInline(fbb, fielddef, table, subobjectdef.minalign(),
                     subobjectdef.bytesize());
          break;
        }
      }
        FLATBUFFERS_FALLTHROUGH();  // fall thru
      case reflection::Union:
      case reflection::String:
      case reflection::Vector:
        fbb.AddOffset(fielddef.offset(), Offset<void>(offsets[offset_idx++]));
        break;
      default: {  // Scalars.
        auto size = GetTypeSize(base_type);
        CopyInline(fbb, fielddef, table, size, size);
        break;
      }
    }
  }
  FLATBUFFERS_ASSERT(offset_idx == offsets.size());
  if (objectdef.is_struct()) {
    fbb.ClearOffsets();
    return fbb.EndStruct();
  } else {
    return fbb.EndTable(start);
  }
}